

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<long_double>::ComputeWeightsLocal
          (TPZDohrSubstruct<long_double> *this,TPZFMatrix<long_double> *StiffnessDiagLocal)

{
  longdouble lVar1;
  longdouble lVar2;
  pair<int,_int> pVar3;
  int iVar4;
  int iVar5;
  int64_t iVar6;
  pair<int,_int> *ppVar7;
  longdouble *plVar8;
  long lVar9;
  int *piVar10;
  long row;
  long in_RDI;
  pair<int,_int> ind_1;
  int nc;
  int c;
  pair<int,_int> ind;
  int neqs;
  int i;
  int64_t in_stack_ffffffffffffff80;
  int64_t in_stack_ffffffffffffff88;
  TPZFMatrix<long_double> *in_stack_ffffffffffffff90;
  undefined4 local_30;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar11;
  pair<int,_int> in_stack_ffffffffffffffe0;
  int iVar12;
  
  iVar6 = TPZVec<std::pair<int,_int>_>::NElements((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x628));
  iVar4 = (int)iVar6;
  for (iVar12 = 0; iVar12 < iVar4; iVar12 = iVar12 + 1) {
    ppVar7 = TPZVec<std::pair<int,_int>_>::operator[]
                       ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x628),(long)iVar12);
    in_stack_ffffffffffffffe0 = *ppVar7;
    plVar8 = TPZVec<long_double>::operator[]
                       ((TPZVec<long_double> *)(in_RDI + 0x4b0),
                        (long)in_stack_ffffffffffffffe0.first);
    lVar1 = *plVar8;
    plVar8 = TPZFMatrix<long_double>::operator()
                       (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                        in_stack_ffffffffffffff80);
    lVar2 = *plVar8;
    plVar8 = TPZVec<long_double>::operator[]
                       ((TPZVec<long_double> *)(in_RDI + 0x4b0),
                        (long)in_stack_ffffffffffffffe0.first);
    *plVar8 = lVar1 / lVar2;
  }
  iVar12 = 0;
  while( true ) {
    lVar9 = (long)iVar12;
    iVar6 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x948));
    if (iVar6 <= lVar9) break;
    in_stack_ffffffffffffff90 = (TPZFMatrix<long_double> *)(in_RDI + 0x4b0);
    piVar10 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 0x948),(long)iVar12);
    plVar8 = TPZVec<long_double>::operator[]
                       ((TPZVec<long_double> *)in_stack_ffffffffffffff90,(long)*piVar10);
    *plVar8 = (longdouble)1;
    iVar12 = iVar12 + 1;
  }
  iVar6 = TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDI + 0x370));
  iVar5 = (int)iVar6;
  lVar9 = in_RDI + 0x400;
  row = (long)iVar4;
  TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDI + 0x370));
  TPZFMatrix<long_double>::Resize
            ((TPZFMatrix<long_double> *)CONCAT44(iVar12,iVar4),(int64_t)in_stack_ffffffffffffffe0,
             CONCAT44(in_stack_ffffffffffffffdc,iVar5));
  for (iVar12 = 0; iVar12 < iVar4; iVar12 = iVar12 + 1) {
    for (iVar11 = 0; iVar11 < iVar5; iVar11 = iVar11 + 1) {
      ppVar7 = TPZVec<std::pair<int,_int>_>::operator[]
                         ((TPZVec<std::pair<int,_int>_> *)(in_RDI + 0x628),(long)iVar12);
      pVar3 = *ppVar7;
      plVar8 = TPZFMatrix<long_double>::operator()(in_stack_ffffffffffffff90,row,lVar9);
      lVar1 = *plVar8;
      local_30 = pVar3.first;
      plVar8 = TPZVec<long_double>::operator[]
                         ((TPZVec<long_double> *)(in_RDI + 0x4b0),(long)local_30);
      lVar2 = *plVar8;
      plVar8 = TPZFMatrix<long_double>::operator()(in_stack_ffffffffffffff90,row,lVar9);
      *plVar8 = lVar2 * lVar1;
    }
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeWeightsLocal(TPZFMatrix<TVar> &StiffnessDiagLocal) {
	int i;
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		fWeights[ind.first] = fWeights[ind.first] / StiffnessDiagLocal(i,0);
	}
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fWeights[fInternalEqs[i]] = 1.;
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weights = " <<  fWeights;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	int c,nc = fPhiC.Cols();
#ifdef ZERO_INTERNAL_RESIDU
	// eliminate the values of v2 for internal equations
	int nint = fInternalEqs.NElements();
	for(i=0; i<nint; i++)
	{
		for(c=0; c<nc; c++)
		{
			fPhiC(fInternalEqs[i],c) = 0.;
		}
	}
#endif
	fPhiC_Weighted_Condensed.Resize(neqs,fPhiC.Cols());
	for (i=0;i<neqs;i++) 
	{
		for(c=0; c<nc; c++)
		{
			std::pair<int,int> ind = fGlobalEqs[i];
			fPhiC_Weighted_Condensed(i,c) = fPhiC(ind.first,c)*fWeights[ind.first];
		}
	}
}